

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_planesurface.cpp
# Opt level: O2

bool __thiscall
ON_PlaneSurface::Split
          (ON_PlaneSurface *this,int dir,double c,ON_Surface **west_or_south_side,
          ON_Surface **east_or_north_side)

{
  ON_Object *p;
  double x;
  bool bVar1;
  ON_PlaneSurface *this_00;
  ON_PlaneSurface *this_01;
  long lVar2;
  undefined4 extraout_XMM0_Da;
  undefined4 extraout_XMM0_Da_00;
  undefined4 extraout_XMM0_Db;
  undefined4 extraout_XMM0_Db_00;
  undefined4 in_XMM1_Da;
  undefined4 in_XMM1_Db;
  double local_60;
  ON_Interval local_58;
  ON_Interval local_48;
  
  if ((uint)dir < 2) {
    (*(this->super_ON_Surface).super_ON_Geometry.super_ON_Object._vptr_ON_Object[0x26])();
    bVar1 = ON_Interval::Includes(&local_58,c,true);
    if (bVar1) {
      (*(this->super_ON_Surface).super_ON_Geometry.super_ON_Object._vptr_ON_Object[0x26])
                (this,(ulong)(uint)dir);
      local_58.m_t[0] = (double)CONCAT44(extraout_XMM0_Db,extraout_XMM0_Da);
      local_58.m_t[1] = (double)CONCAT44(in_XMM1_Db,in_XMM1_Da);
      lVar2 = (ulong)(dir != 0) * 0x10;
      local_48.m_t[0] = *(double *)(&this->field_0xb0 + lVar2);
      local_48.m_t[1] = *(double *)((long)(&this->field_0xb0 + lVar2) + 8);
      bVar1 = ON_Interval::operator==(&local_58,&local_48);
      local_60 = c;
      if (!bVar1) {
        local_58.m_t[0] = *(double *)(&this->field_0xb0 + lVar2);
        local_58.m_t[1] = *(double *)((long)(&this->field_0xb0 + lVar2) + 8);
        (*(this->super_ON_Surface).super_ON_Geometry.super_ON_Object._vptr_ON_Object[0x26])
                  (this,(ulong)(uint)dir);
        local_48.m_t[0] = (double)CONCAT44(extraout_XMM0_Db_00,extraout_XMM0_Da_00);
        local_48.m_t[1] = (double)CONCAT44(in_XMM1_Db,in_XMM1_Da);
        x = ON_Interval::NormalizedParameterAt(&local_48,c);
        local_60 = ON_Interval::ParameterAt(&local_58,x);
        local_58.m_t[0] = *(double *)(&this->field_0xb0 + lVar2);
        local_58.m_t[1] = *(double *)((long)(&this->field_0xb0 + lVar2) + 8);
        bVar1 = ON_Interval::Includes(&local_58,local_60,true);
        if (!bVar1) {
          return false;
        }
      }
      p = (ON_Object *)*west_or_south_side;
      if (p == (ON_Object *)0x0) {
        this_00 = (ON_PlaneSurface *)0x0;
      }
      else {
        if (p == (ON_Object *)*east_or_north_side) {
          return false;
        }
        this_00 = Cast(p);
        if (this_00 == (ON_PlaneSurface *)0x0) {
          return false;
        }
      }
      if ((ON_Object *)*east_or_north_side == (ON_Object *)0x0) {
        this_01 = (ON_PlaneSurface *)0x0;
      }
      else {
        this_01 = Cast((ON_Object *)*east_or_north_side);
        if (this_01 == (ON_PlaneSurface *)0x0) {
          return false;
        }
      }
      if (this_00 == (ON_PlaneSurface *)0x0) {
        this_00 = (ON_PlaneSurface *)operator_new(0xd0);
        ON_PlaneSurface(this_00);
      }
      if (this_01 == (ON_PlaneSurface *)0x0) {
        this_01 = (ON_PlaneSurface *)operator_new(0xd0);
        ON_PlaneSurface(this_01);
      }
      operator=(this_00,this);
      operator=(this_01,this);
      lVar2 = (ulong)(uint)dir * 0x10;
      *(double *)(&this_00->field_0x98 + lVar2) = c;
      *(double *)(&this_01->field_0x90 + lVar2) = c;
      *(double *)(&this_00->field_0xb8 + lVar2) = local_60;
      *(double *)(&this_01->field_0xb0 + lVar2) = local_60;
      *west_or_south_side = &this_00->super_ON_Surface;
      *east_or_north_side = &this_01->super_ON_Surface;
      return true;
    }
  }
  return false;
}

Assistant:

bool ON_PlaneSurface::Split(
       int dir,
       double c,
       ON_Surface*& west_or_south_side,
       ON_Surface*& east_or_north_side
       ) const
{
  ON_PlaneSurface* ws_side = 0;
  ON_PlaneSurface* en_side = 0;

  if ( dir < 0 || dir > 1 )
    return false;
  if ( !Domain(dir).Includes(c,true) )
    return false;

  double t;
  if ( Domain(dir) == Extents(dir) )
    t = c;
  else
  {
    t = Extents(dir).ParameterAt( Domain(dir).NormalizedParameterAt(c) );
    if ( !Extents(dir).Includes(t,true) )
      return false;
  }

  if ( west_or_south_side )
  {
    if ( west_or_south_side == east_or_north_side )
      return false;
    ws_side = ON_PlaneSurface::Cast(west_or_south_side);
    if ( !ws_side )
      return false;
  }

  if ( east_or_north_side )
  {
    en_side = ON_PlaneSurface::Cast(east_or_north_side);
    if ( !en_side )
      return false;
  }

  if ( !ws_side )
    ws_side = new ON_PlaneSurface();
  if ( !en_side )
    en_side = new ON_PlaneSurface();

  *ws_side = *this;
  *en_side = *this;
  ws_side->m_domain[dir].m_t[1] = c;
  en_side->m_domain[dir].m_t[0] = c;
  ws_side->m_extents[dir].m_t[1] = t;
  en_side->m_extents[dir].m_t[0] = t;

  west_or_south_side = ws_side;
  east_or_north_side = en_side;

  return true;
}